

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O0

int minimalFlip1(word *pInOut,word *pMinimal,word *PDuplicat,int nVars)

{
  int iVar1;
  int iVar2;
  int local_30;
  int blockSize;
  int i;
  int nVars_local;
  word *PDuplicat_local;
  word *pMinimal_local;
  word *pInOut_local;
  
  iVar1 = Kit_TruthWordNum_64bit(nVars);
  iVar1 = iVar1 << 3;
  memcpy(pMinimal,pInOut,(long)iVar1);
  memcpy(PDuplicat,pInOut,(long)iVar1);
  Kit_TruthChangePhase_64bit(pInOut,nVars,0);
  for (local_30 = 1; local_30 < nVars; local_30 = local_30 + 1) {
    iVar2 = memCompare(pMinimal,pInOut,nVars);
    if (iVar2 == 1) {
      memcpy(pMinimal,pInOut,(long)iVar1);
      Kit_TruthChangePhase_64bit(pInOut,nVars,local_30);
    }
    else {
      memcpy(pInOut,pMinimal,(long)iVar1);
      Kit_TruthChangePhase_64bit(pInOut,nVars,local_30);
    }
  }
  iVar2 = memCompare(pMinimal,pInOut,nVars);
  if (iVar2 == -1) {
    memcpy(pInOut,pMinimal,(long)iVar1);
  }
  iVar1 = memcmp(pInOut,PDuplicat,(long)iVar1);
  pInOut_local._4_4_ = (uint)(iVar1 != 0);
  return pInOut_local._4_4_;
}

Assistant:

int minimalFlip1(word* pInOut, word* pMinimal, word* PDuplicat, int  nVars) 
{
    int i;
    int blockSize = Kit_TruthWordNum_64bit( nVars )*sizeof(word);
    memcpy(pMinimal, pInOut, (size_t)blockSize);
    memcpy(PDuplicat, pInOut, (size_t)blockSize);
    Kit_TruthChangePhase_64bit( pInOut, nVars, 0 );
    for(i=1;i<nVars;i++)
    {
        if( memCompare(pMinimal,pInOut,nVars) == 1)
        {
            memcpy(pMinimal, pInOut, (size_t)blockSize);
            Kit_TruthChangePhase_64bit( pInOut, nVars, i );
        }
        else
        {
            memcpy(pInOut, pMinimal, (size_t)blockSize);
            Kit_TruthChangePhase_64bit( pInOut, nVars, i );
        }
    }
    if( memCompare(pMinimal,pInOut,nVars) == -1)
        memcpy(pInOut, pMinimal, (size_t)blockSize);
    if(memcmp(pInOut,PDuplicat,(size_t)blockSize) == 0)
        return 0;
    else
        return 1;
}